

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp analyze_define_syntax(sexp ctx,sexp x)

{
  sexp tmp;
  sexp_gc_var_t local_28;
  sexp local_18;
  
  local_28.var = &local_18;
  local_18 = (sexp)0x43e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  local_18 = sexp_cons_op(ctx,(sexp)0x0,2,(x->value).type.cpl,(sexp)&DAT_0000023e);
  if ((((ulong)local_18 & 3) != 0) || (local_18->tag != 0x13)) {
    local_18 = analyze_bind_syntax(local_18,ctx,ctx,0);
  }
  (ctx->value).context.saves = local_28.next;
  return local_18;
}

Assistant:

static sexp analyze_define_syntax (sexp ctx, sexp x) {
  sexp res;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  tmp = sexp_list1(ctx, sexp_cdr(x));
  res = sexp_exceptionp(tmp) ? tmp : analyze_bind_syntax(tmp, ctx, ctx, 0);
  sexp_gc_release1(ctx);
  return res;
}